

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongAdder.cc
# Opt level: O0

value_t __thiscall cppmetrics::LongAdder::count(LongAdder *this)

{
  bool bVar1;
  reference ppCVar2;
  value_t vVar3;
  Cell **cell;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_> *__range1;
  value_t base;
  LongAdder *this_local;
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  __range1 = (vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>
              *)(this->m_base_count).super___atomic_base<long>._M_i;
  __end1 = std::
           vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>::
           begin(&this->m_cells);
  cell = (Cell **)std::
                  vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>
                  ::end(&this->m_cells);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cppmetrics::LongAdder::Cell_*const_*,_std::vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>_>
                                     *)&cell), bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<cppmetrics::LongAdder::Cell_*const_*,_std::vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>_>
              ::operator*(&__end1);
    if (*ppCVar2 != (Cell *)0x0) {
      vVar3 = Cell::value(*ppCVar2);
      __range1 = (vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>
                  *)((long)&(__range1->
                            super__Vector_base<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>
                            )._M_impl.super__Vector_impl_data._M_start + vVar3);
    }
    __gnu_cxx::
    __normal_iterator<cppmetrics::LongAdder::Cell_*const_*,_std::vector<cppmetrics::LongAdder::Cell_*,_std::allocator<cppmetrics::LongAdder::Cell_*>_>_>
    ::operator++(&__end1);
  }
  return (value_t)__range1;
}

Assistant:

LongAdder::value_t LongAdder::count() const noexcept
{
  value_t base = m_base_count.load(std::memory_order_acquire);

  for (auto&& cell : m_cells)
  {
    if (cell != nullptr)
    {
      base += cell->value();
    }
  }

  return base;
}